

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_attach_connection(Curl_easy *data,connectdata *conn)

{
  _func_void_Curl_easy_ptr_connectdata_ptr *p_Var1;
  
  data->conn = conn;
  Curl_llist_insert_next(&conn->easyq,(conn->easyq).tail,data,&data->conn_queue);
  p_Var1 = conn->handler->attach;
  if (p_Var1 != (_func_void_Curl_easy_ptr_connectdata_ptr *)0x0) {
    (*p_Var1)(data,conn);
  }
  Curl_ssl_associate_conn(data,conn);
  return;
}

Assistant:

void Curl_attach_connection(struct Curl_easy *data,
                             struct connectdata *conn)
{
  DEBUGASSERT(!data->conn);
  DEBUGASSERT(conn);
  data->conn = conn;
  Curl_llist_insert_next(&conn->easyq, conn->easyq.tail, data,
                         &data->conn_queue);
  if(conn->handler->attach)
    conn->handler->attach(data, conn);
  Curl_ssl_associate_conn(data, conn);
}